

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactionProduct.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<6>::ReactionProduct::ReactionProduct
          (ReactionProduct *this,ReactionProduct *param_1)

{
  TabulationRecord::TabulationRecord((TabulationRecord *)this,(TabulationRecord *)param_1);
  std::__detail::__variant::
  _Move_ctor_base<false,_njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
  ::_Move_ctor_base((_Move_ctor_base<false,_njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     *)&this->law_,
                    (_Move_ctor_base<false,_njoy::ENDFtk::section::Type<6>::DefinedElsewhere,_njoy::ENDFtk::section::Type<6>::Unknown,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyScattering,_njoy::ENDFtk::section::Type<6>::IsotropicDiscreteEmission,_njoy::ENDFtk::section::Type<6>::DiscreteTwoBodyRecoils,_njoy::ENDFtk::section::Type<6>::ChargedParticleElasticScattering,_njoy::ENDFtk::section::Type<6>::NBodyPhaseSpace,_njoy::ENDFtk::section::Type<6>::LaboratoryAngleEnergy>
                     *)&param_1->law_);
  return;
}

Assistant:

class ENDFTK_PYTHON_EXPORT ReactionProduct {

  /* fields */
  Multiplicity multiplicity_;
  Distribution law_;

  /* auxiliary functions */
  #include "ENDFtk/section/6/ReactionProduct/src/verifyLAW.hpp"
  #include "ENDFtk/section/6/ReactionProduct/src/readDistribution.hpp"

public:

  /* constructor */
  #include "ENDFtk/section/6/ReactionProduct/src/ctor.hpp"

  /* methods */

  /**
   *  @brief Return the ZA identifier of the reaction product
   */
  int ZAP() const { return this->multiplicity_.ZAP(); }

  /**
   *  @brief Return the ZA identifier of the reaction product
   */
  int productIdentifier() const { return this->ZAP(); }

  /**
   *  @brief Return the atomic weight ratio of the reaction product
   */
  double AWP() const { return this->multiplicity_.AWP(); }

  /**
   *  @brief Return the atomic weight ratio of the reaction product
   */
  double productWeightRatio() const { return this->AWP(); }

  /**
   *  @brief Return the product modifier flag
   */
  int LIP() const { return this->multiplicity_.LIP(); }

  /**
   *  @brief Return the product modifier flag
   */
  int productModifierFlag() const { return this->LIP(); }

  /**
   *  @brief Return the distribution type (the LAW flag)
   */
  int LAW() const { return this->multiplicity_.LAW(); }

  /**
   *  @brief Return the multiplicity
   */
  const Multiplicity& multiplicity() const { return this->multiplicity_; }

  /**
   *  @brief Return the distribution
   */
  const Distribution& distribution() const { return this->law_; }

  /**
   *  @brief Return the number of lines in this MF6 component
   */
  long NC() const { return this->multiplicity_.NC()
                             + std::visit( [] ( const auto& v ) -> long
                                              { return v.NC(); },
                                           this->law_ ); }

  #include "ENDFtk/section/6/ReactionProduct/src/print.hpp"
}